

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

String * __thiscall
capnp::JsonCodec::encode<capnp::Data::Reader>
          (String *__return_storage_ptr__,JsonCodec *this,Reader *value)

{
  Reader local_50;
  
  local_50.field_1.intValue = (int64_t)(value->super_ArrayPtr<const_unsigned_char>).ptr;
  local_50.field_1.textValue.super_StringPtr.content.size_ =
       (value->super_ArrayPtr<const_unsigned_char>).size_;
  local_50.type = DATA;
  encode(__return_storage_ptr__,this,&local_50,(Type)ZEXT816(0xd));
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}